

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

StepStatus __thiscall
adios2::core::engine::BP4Reader::BeginStep(BP4Reader *this,StepMode mode,float timeoutSeconds)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  ulong __val;
  IO *this_00;
  bool bVar5;
  char cVar6;
  byte bVar7;
  int iVar8;
  StepStatus SVar9;
  size_t sVar10;
  ulong uVar11;
  char cVar12;
  string local_e0;
  string __str;
  string local_a0;
  string local_80;
  float local_5c;
  ScopedTimer __var281;
  string local_50;
  
  local_5c = timeoutSeconds;
  if ((BeginStep(adios2::StepMode,float)::__var81 == '\0') &&
     (iVar8 = __cxa_guard_acquire(&BeginStep(adios2::StepMode,float)::__var81), iVar8 != 0)) {
    BeginStep::__var81 = (void *)ps_timer_create_("BP4Reader::BeginStep");
    __cxa_guard_release(&BeginStep(adios2::StepMode,float)::__var81);
  }
  __var281.m_timer = BeginStep::__var81;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Engine","");
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BP4Reader","");
  paVar2 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BeginStep","");
  __val = this->m_CurrentStep;
  cVar12 = '\x01';
  if (9 < __val) {
    uVar11 = __val;
    cVar6 = '\x04';
    do {
      cVar12 = cVar6;
      if (uVar11 < 100) {
        cVar12 = cVar12 + -2;
        goto LAB_0043ea1a;
      }
      if (uVar11 < 1000) {
        cVar12 = cVar12 + -1;
        goto LAB_0043ea1a;
      }
      if (uVar11 < 10000) goto LAB_0043ea1a;
      bVar5 = 99999 < uVar11;
      uVar11 = uVar11 / 10000;
      cVar6 = cVar12 + '\x04';
    } while (bVar5);
    cVar12 = cVar12 + '\x01';
  }
LAB_0043ea1a:
  paVar3 = &__str.field_2;
  __str._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct((ulong)&__str,cVar12);
  std::__detail::__to_chars_10_impl<unsigned_long>
            (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
  iVar8 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_e0,&local_80,&local_a0,&__str,0,iVar8,5,this->m_Verbosity,INFO);
  paVar4 = &local_e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != paVar3) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != paVar4) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  if (mode != Read) {
    local_e0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Engine","");
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BP4Reader","");
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BeginStep","");
    __str._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str,
               "mode is not supported yet, only Read is valid for engine BP4Reader, in call to BeginStep"
               ,"");
    helper::Throw<std::invalid_argument>(&local_e0,&local_80,&local_a0,&__str,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar3) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar4) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  if ((this->super_Engine).m_BetweenStepPairs == true) {
    local_e0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Engine","");
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BP4Reader","");
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BeginStep","");
    __str._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str,
               "BeginStep() is called a second time without an intervening EndStep()","");
    helper::Throw<std::logic_error>(&local_e0,&local_80,&local_a0,&__str,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar3) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar4) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  if (*(long *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x390 +
               (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) != 0) {
    local_e0._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"Engine","");
    local_80._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BP4Reader","");
    local_a0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"BeginStep","");
    __str._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&__str,
               "existing variables subscribed with GetDeferred, did you forget to call PerformGets() or EndStep()?, in call to BeginStep"
               ,"");
    helper::Throw<std::invalid_argument>(&local_e0,&local_80,&local_a0,&__str,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != paVar3) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != paVar2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != paVar1) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar4) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
  }
  ((this->super_Engine).m_IO)->m_ReadStreaming = true;
  bVar7 = this->m_FirstStep;
  if ((bool)bVar7 == true) {
    if (*(long *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x1d0 +
                 (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) == 0) {
LAB_0043ed91:
      SVar9 = CheckForNewSteps(this,(Seconds)(double)local_5c);
      if (SVar9 != OK) goto LAB_0043ee44;
      bVar7 = this->m_FirstStep;
    }
  }
  else if (*(ulong *)((this->m_BP4Deserializer)._vptr_BP4Deserializer[-4] + 0x1d0 +
                     (long)&(this->m_BP4Deserializer)._vptr_BP4Deserializer) <=
           this->m_CurrentStep + 1) goto LAB_0043ed91;
  (this->super_Engine).m_BetweenStepPairs = true;
  if ((bVar7 & 1) == 0) {
    sVar10 = this->m_CurrentStep + 1;
    this->m_CurrentStep = sVar10;
  }
  else {
    this->m_FirstStep = false;
    sVar10 = this->m_CurrentStep;
  }
  this_00 = (this->super_Engine).m_IO;
  this_00->m_EngineStep = sVar10;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"in call to BP4 Reader BeginStep","");
  IO::ResetVariablesStepSelection(this_00,false,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  IO::SetPrefixedNames((this->super_Engine).m_IO,true);
  SVar9 = OK;
LAB_0043ee44:
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var281);
  return SVar9;
}

Assistant:

StepStatus BP4Reader::BeginStep(StepMode mode, const float timeoutSeconds)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::BeginStep");
    helper::Log("Engine", "BP4Reader", "BeginStep", std::to_string(CurrentStep()), 0, m_Comm.Rank(),
                5, m_Verbosity, helper::LogMode::INFO);

    if (mode != StepMode::Read)
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "BeginStep",
                                             "mode is not supported yet, "
                                             "only Read is valid for "
                                             "engine BP4Reader, in call to "
                                             "BeginStep");
    }

    if (m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>("Engine", "BP4Reader", "BeginStep",
                                        "BeginStep() is called a second time "
                                        "without an intervening EndStep()");
    }

    if (!m_BP4Deserializer.m_DeferredVariables.empty())
    {
        helper::Throw<std::invalid_argument>("Engine", "BP4Reader", "BeginStep",
                                             "existing variables subscribed with "
                                             "GetDeferred, did you forget to call "
                                             "PerformGets() or EndStep()?, in call to BeginStep");
    }

    // used to inquire for variables in streaming mode
    m_IO.m_ReadStreaming = true;
    StepStatus status = StepStatus::OK;

    if (m_FirstStep)
    {
        if (m_BP4Deserializer.m_MetadataSet.StepsCount == 0)
        {
            status = CheckForNewSteps(Seconds(timeoutSeconds));
        }
    }
    else
    {
        if (m_CurrentStep + 1 >= m_BP4Deserializer.m_MetadataSet.StepsCount)
        {
            status = CheckForNewSteps(Seconds(timeoutSeconds));
        }
    }

    // This should be after getting new steps

    if (status == StepStatus::OK)
    {
        m_BetweenStepPairs = true;
        if (m_FirstStep)
        {
            m_FirstStep = false;
        }
        else
        {
            ++m_CurrentStep;
        }

        m_IO.m_EngineStep = m_CurrentStep;
        m_IO.ResetVariablesStepSelection(false, "in call to BP4 Reader BeginStep");

        // caches attributes for each step
        // if a variable name is a prefix
        // e.g. var  prefix = {var/v1, var/v2, var/v3}
        m_IO.SetPrefixedNames(true);
    }

    return status;
}